

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cache.c
# Opt level: O3

void mbedtls_ssl_cache_init(mbedtls_ssl_cache_context *cache)

{
  cache->chain = (mbedtls_ssl_cache_entry *)0x0;
  cache->timeout = 0x15180;
  cache->max_entries = 0x32;
  return;
}

Assistant:

void mbedtls_ssl_cache_init( mbedtls_ssl_cache_context *cache )
{
    memset( cache, 0, sizeof( mbedtls_ssl_cache_context ) );

    cache->timeout = MBEDTLS_SSL_CACHE_DEFAULT_TIMEOUT;
    cache->max_entries = MBEDTLS_SSL_CACHE_DEFAULT_MAX_ENTRIES;

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_init( &cache->mutex );
#endif
}